

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O0

void __thiscall
kj::_::Debug::Fault::
Fault<kj::Exception::Type,bool&,char_const(&)[19],long_long&,long_long&,long_long&>
          (Fault *this,char *file,int line,Type code,char *condition,char *macroArgs,bool *params,
          char (*params_1) [19],longlong *params_2,longlong *params_3,longlong *params_4)

{
  undefined4 in_register_00000014;
  char (*params_00) [19];
  longlong *params_01;
  longlong *params_02;
  longlong *params_03;
  ArrayDisposer **local_110;
  undefined1 local_a8 [8];
  String argValues [5];
  char *macroArgs_local;
  char *condition_local;
  Type code_local;
  int line_local;
  char *file_local;
  Fault *this_local;
  
  this->exception = (Exception *)0x0;
  argValues[4].content.disposer = (ArrayDisposer *)macroArgs;
  str<bool&>((String *)local_a8,(kj *)params,(bool *)CONCAT44(in_register_00000014,line));
  str<char_const(&)[19]>((String *)&argValues[0].content.disposer,(kj *)params_1,params_00);
  str<long_long&>((String *)&argValues[1].content.disposer,(kj *)params_2,params_01);
  str<long_long&>((String *)&argValues[2].content.disposer,(kj *)params_3,params_02);
  str<long_long&>((String *)&argValues[3].content.disposer,(kj *)params_4,params_03);
  arrayPtr<kj::String>((String *)local_a8,5);
  init(this,(EVP_PKEY_CTX *)file);
  local_110 = &argValues[4].content.disposer;
  do {
    local_110 = local_110 + -3;
    String::~String((String *)local_110);
  } while (local_110 != (ArrayDisposer **)local_a8);
  return;
}

Assistant:

Debug::Fault::Fault(const char* file, int line, Code code,
                    const char* condition, const char* macroArgs, Params&&... params)
    : exception(nullptr) {
  String argValues[sizeof...(Params)] = {str(params)...};
  init(file, line, code, condition, macroArgs,
       arrayPtr(argValues, sizeof...(Params)));
}